

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O2

err_t RenderDataInt(ebml_integer *Element,stream *Output,bool_t bForceWithoutMandatory,
                   bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  int iVar1;
  err_t eVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint8_t FinalData [8];
  undefined8 local_18;
  undefined1 local_10 [8];
  
  if (((Element->Base).SizeLength < '\t') && (lVar5 = (Element->Base).DataSize, lVar5 != 0)) {
    iVar1 = (Element->Base).DefaultSize;
    lVar4 = (long)iVar1;
    lVar3 = lVar5;
    if (lVar5 < lVar4) {
      lVar3 = (long)(int)(~(uint)lVar5 + iVar1);
      while (lVar3 != 0) {
        local_10[lVar3 + -1] = 0;
        lVar3 = lVar3 + -1;
      }
      lVar3 = (long)(int)(iVar1 - (uint)lVar5);
    }
    uVar6 = Element->Value;
    while (lVar3 != 0) {
      local_10[lVar3 + -1] = (char)uVar6;
      uVar6 = uVar6 >> 8;
      lVar3 = lVar3 + -1;
    }
    local_18 = 0;
    if (lVar5 < lVar4) {
      lVar5 = lVar4;
      if (Output == (stream *)0x0) {
        __assert_fail("(const void*)(Output)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                      ,0x9b,
                      "err_t RenderDataInt(ebml_integer *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                     );
      }
    }
    else if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0x9d,
                    "err_t RenderDataInt(ebml_integer *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    eVar2 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,local_10,lVar5,&local_18);
    if (Rendered != (filepos_t *)0x0) {
      *Rendered = local_18;
    }
  }
  else {
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

static err_t RenderDataInt(ebml_integer *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    uint8_t FinalData[8]; // we don't handle more than 64 bits integers
    size_t i;
    uint64_t TempValue = Element->Value;
    err_t Err;

    if (Element->Base.SizeLength > EBML_MAX_SIZE)
        return 0; // integers larger than 64 bits are not supported

    if (Element->Base.DataSize == 0)
        return 0; // nothing to write

    TempValue = Element->Value;
    if (Element->Base.DefaultSize > Element->Base.DataSize)
    {
        for (i=Element->Base.DefaultSize - (int)Element->Base.DataSize - 1;i;--i)
            FinalData[i-1] = 0;
        i = Element->Base.DefaultSize - (int)Element->Base.DataSize;
    }
    else
        i=(size_t)Element->Base.DataSize;
    for (;i;--i) {
        FinalData[i-1] = (uint8_t)(TempValue & 0xFF);
        TempValue >>= 8;
    }

    if (Element->Base.DefaultSize > Element->Base.DataSize)
        Err = Stream_Write(Output,FinalData,(size_t)Element->Base.DefaultSize,&i);
    else
        Err = Stream_Write(Output,FinalData,(size_t)Element->Base.DataSize,&i);
    if (Rendered)
        *Rendered = i;
    return Err;
}